

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O3

ostream * sciplot::gnuplot::
          writedataset<std::valarray<double>,std::vector<double,std::allocator<double>>>
                    (ostream *out,size_t index,valarray<double> *args,
                    vector<double,_std::allocator<double>_> *args_1)

{
  char cVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"#==============================================================================",
             0x4f);
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"# DATASET #",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"#==============================================================================",
             0x4f);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  internal::write<std::valarray<double>,std::vector<double,std::allocator<double>>>(out,args,args_1)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  return out;
}

Assistant:

auto writedataset(std::ostream& out, std::size_t index, const Args&... args) -> std::ostream&
{
    // Save the given vectors x and y in a new data set of the data file
    out << "#==============================================================================" << std::endl;
    out << "# DATASET #" << index << std::endl;
    out << "#==============================================================================" << std::endl;

    // White the vector arguments to the ostream object
    internal::write(out, args...);

    // Ensure two blank lines are added here so that gnuplot understands a new data set has been added
    out << "\n\n";

    return out;
}